

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp-server.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__src;
  uint uVar1;
  int iVar2;
  ushort **ppuVar3;
  size_t local_100;
  uint _b;
  unsigned_long _a;
  int local_c0;
  int temp_timeout;
  int option_index;
  int c;
  char *log_file;
  uint8_t ret_dscp;
  char *pcStack_a8;
  uint8_t app_bit;
  char *server_ip;
  server_info_t server_info_storage;
  suseconds_t timeout_us;
  uint8_t default_result_code;
  uint8_t end_after_recv;
  uint8_t pcp_version;
  char *pcStack_20;
  int test_port;
  char *port;
  char **argv_local;
  int argc_local;
  
  pcStack_20 = "5351";
  timeout_us._3_1_ = 2;
  timeout_us._2_1_ = 0;
  timeout_us._1_1_ = 0xff;
  server_info_storage.epoch_time_start = 0;
  pcStack_a8 = "0.0.0.0";
  log_file._7_1_ = '\0';
  log_file._6_1_ = '\0';
  _option_index = (char *)0x0;
  local_c0 = 0;
  _opterr = 0;
  while( true ) {
    while( true ) {
      temp_timeout = getopt_long(argc,argv,"hr:v:p:",main::long_options,&local_c0);
      if (temp_timeout == -1) {
        server_ip._2_1_ = timeout_us._1_1_;
        server_ip._1_1_ = timeout_us._2_1_;
        server_ip._0_1_ = timeout_us._3_1_;
        server_info_storage._80_8_ = server_info_storage.epoch_time_start / 1000;
        server_info_storage.tv.tv_sec = (server_info_storage.epoch_time_start % 1000) * 1000;
        server_info_storage.tv.tv_usec = time((time_t *)0x0);
        __src = _option_index;
        server_info_storage.ext_ip.__in6_u.__u6_addr8[8] = log_file._7_1_;
        server_info_storage.ext_ip.__in6_u.__u6_addr8[9] = log_file._6_1_;
        if (_option_index == (char *)0x0) {
          server_info_storage.ext_ip.__in6_u.__u6_addr8[10] = '\0';
        }
        else {
          local_100 = strlen(_option_index);
          local_100 = local_100 + 1;
          if (0x40 < local_100) {
            local_100 = 0x40;
          }
          memcpy((void *)((long)&server_info_storage.ext_ip.__in6_u + 10),__src,local_100);
        }
        printf("Server listening on %s:%s \n",pcStack_a8,pcStack_20);
        iVar2 = execPCPServer(pcStack_20,pcStack_a8,(server_info_t *)&server_ip);
        return iVar2;
      }
      if (temp_timeout != 0) break;
      if (main::long_options[local_c0].name != (char *)0x0) {
        iVar2 = strcmp(main::long_options[local_c0].name,"ear");
        if (iVar2 == 0) {
          iVar2 = atoi(_optarg);
          timeout_us._2_1_ = (undefined1)iVar2;
        }
        iVar2 = strcmp(main::long_options[local_c0].name,"timeout");
        if (iVar2 == 0) {
          uVar1 = atoi(_optarg);
          if ((int)uVar1 < 0) {
            printf("Value provided for timeout was negative %d. Please provide correct value.\n",
                   (ulong)uVar1);
            exit(1);
          }
          iVar2 = atoi(_optarg);
          server_info_storage.epoch_time_start = (time_t)iVar2;
        }
        iVar2 = strcmp(main::long_options[local_c0].name,"app-bit");
        if (iVar2 == 0) {
          log_file._7_1_ = '\x01';
        }
        iVar2 = strcmp(main::long_options[local_c0].name,"ret-dscp");
        if (iVar2 == 0) {
          iVar2 = atoi(_optarg);
          log_file._6_1_ = (uint8_t)iVar2;
        }
        iVar2 = strcmp(main::long_options[local_c0].name,"log-file");
        if (iVar2 == 0) {
          _option_index = _optarg;
        }
        iVar2 = strcmp(main::long_options[local_c0].name,"ip");
        if (iVar2 == 0) {
          pcStack_a8 = _optarg;
        }
        iVar2 = strcmp(main::long_options[local_c0].name,"ext-ip");
        if (iVar2 == 0) {
          inet_pton(10,_optarg,(void *)((long)&server_ip + 4));
        }
        iVar2 = strcmp(main::long_options[local_c0].name,"help");
        if (iVar2 == 0) {
          print_usage();
          exit(1);
        }
      }
    }
    if (temp_timeout == 0x3f) {
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(int)_optopt] & 0x4000) == 0) {
        fprintf(_stderr,"Unknown option character `\\x%x\'.\n",(ulong)_optopt);
      }
      else {
        fprintf(_stderr,"Unknown option `-%c\'.\n",(ulong)_optopt);
      }
      print_usage();
      exit(1);
    }
    if (temp_timeout == 0x68) break;
    if (temp_timeout == 0x70) {
      uVar1 = atoi(_optarg);
      if (((int)uVar1 < 1) || (0xffff < (int)uVar1)) {
        printf("Bad value for option -p %d \n",(ulong)uVar1);
        printf("Port value can be in range 1-65535. \n");
        printf("Default value will be used. \n");
      }
      else {
        pcStack_20 = _optarg;
      }
    }
    else if (temp_timeout == 0x72) {
      iVar2 = atoi(_optarg);
      timeout_us._1_1_ = (byte)iVar2;
      if ((0xd < timeout_us._1_1_) && (timeout_us._1_1_ != 0xff)) {
        printf("Unsupported  RESULT CODE %d (acceptable values 0 <= result_code <= 13 or result_code == 255)\n"
               ,(ulong)timeout_us._1_1_);
        exit(1);
      }
    }
    else {
      if (temp_timeout != 0x76) {
        print_usage();
        exit(1);
      }
      iVar2 = atoi(_optarg);
      timeout_us._3_1_ = (byte)iVar2;
      if ((timeout_us._3_1_ == 0) || (2 < timeout_us._3_1_)) {
        printf("Version %d is not supported! \n",(ulong)timeout_us._3_1_);
        exit(1);
      }
    }
  }
  print_usage();
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {

    const char *port = PCP_PORT;
    int test_port;
    uint8_t pcp_version = PCP_TEST_MAX_VERSION;
    uint8_t end_after_recv = 0;
    uint8_t default_result_code = 255;
#ifdef WIN32
    long timeout_us = 0;
#else
    suseconds_t timeout_us = 0;
#endif
    server_info_t server_info_storage;
    const char *server_ip = "0.0.0.0";
    uint8_t app_bit = 0;
    uint8_t ret_dscp = 0;
    char *log_file = NULL;

    {
        int c;
        int option_index = 0;

        static struct option long_options[] = {
            {"ear", required_argument, 0, 0},
            {"help", no_argument, 0, 0},
            {"ip", required_argument, 0, 0},
            {"ext-ip", required_argument, 0, 0},
            {"timeout", required_argument, 0, 0},
            {"app-bit", no_argument, 0, 0},
            {"ret-dscp", required_argument, 0, 0},
            {"log-file", required_argument, 0, 0},
            {0, 0, 0, 0}};

        opterr = 0;
        while ((c = getopt_long(argc, argv, "hr:v:p:", long_options,
                                &option_index)) != -1) {
            switch (c) {
            // assign values for long options
            case 0:
                if (!long_options[option_index].name) {
                    break;
                }

                if (!strcmp(long_options[option_index].name, "ear"))
                    end_after_recv = (uint8_t)atoi(optarg);

                if (!strcmp(long_options[option_index].name, "timeout")) {
                    int temp_timeout = atoi(optarg);
                    if (temp_timeout < 0) {
                        printf("Value provided for timeout was negative %d. "
                               "Please provide correct value.\n",
                               temp_timeout);
                        exit(1);
                    } else {
#ifdef WIN32
                        timeout_us = (long)atoi(optarg);
#else
                        timeout_us = (suseconds_t)atoi(optarg);
#endif
                    }
                }

                if (!strcmp(long_options[option_index].name, "app-bit")) {
                    app_bit = 1;
                }

                if (!strcmp(long_options[option_index].name, "ret-dscp")) {
                    ret_dscp = (uint8_t)atoi(optarg);
                }

                if (!strcmp(long_options[option_index].name, "log-file")) {
                    log_file = optarg;
                }

                if (!strcmp(long_options[option_index].name, "ip"))
                    server_ip = optarg;

                if (!strcmp(long_options[option_index].name, "ext-ip")) {
                    inet_pton(AF_INET6, optarg, &server_info_storage.ext_ip);
                }

                if (!strcmp(long_options[option_index].name, "help")) {
                    print_usage();
                    exit(1);
                }

                break;
            case 'h':
                print_usage();
                exit(1);
                break;
            case 'p':
                test_port = atoi(optarg);
                if ((test_port < 1) || (test_port > 65535)) {
                    printf("Bad value for option -p %d \n", test_port);
                    printf("Port value can be in range 1-65535. \n");
                    printf("Default value will be used. \n");
                } else {
                    port = optarg;
                }
                break;
            case 'r':
                default_result_code = (uint8_t)atoi(optarg);
                if (default_result_code > 13 && default_result_code != 255) {
                    printf("Unsupported  RESULT CODE %d (acceptable values "
                           "0 <= result_code <= 13 or result_code == 255)\n",
                           default_result_code);
                    exit(1);
                }
                break;
            case 'v':
                pcp_version = (uint8_t)atoi(optarg);
                if (pcp_version < 1 || pcp_version > 2) {
                    printf("Version %d is not supported! \n", pcp_version);
                    exit(1);
                }
                break;
            case '?':
                if (isprint(optopt))
                    fprintf(stderr, "Unknown option `-%c'.\n", optopt);
                else
                    fprintf(stderr, "Unknown option character `\\x%x'.\n",
                            optopt);
                print_usage();
                exit(1);
            default: // LCOV_EXCL_START
                print_usage();
                exit(1);
                break; // LCOV_EXCL_STOP
            }
        }
    }

    server_info_storage.default_result_code = default_result_code;
    server_info_storage.end_after_recv = end_after_recv;
    server_info_storage.server_version = pcp_version;
    server_info_storage.tv.tv_sec = timeout_us / 1000;
    server_info_storage.tv.tv_usec = (timeout_us % 1000) * 1000;
    server_info_storage.epoch_time_start = time(NULL);
    server_info_storage.app_bit = app_bit;
    server_info_storage.ret_dscp = ret_dscp;
    if (log_file != NULL) {
        memcpy(&(server_info_storage.log_file[0]), log_file,
               min(strlen(log_file) + 1, MAX_LOG_FILE));
    } else {
        server_info_storage.log_file[0] = 0;
    }

    printf("Server listening on %s:%s \n", server_ip, port);
    return execPCPServer(port, server_ip, &server_info_storage);
}